

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O3

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *box_lower,
          vector<double,_std::allocator<double>_> *box_upper,function<double_()> *get_random01)

{
  double *box_lower_00;
  double *box_upper_00;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  _Any_data local_50;
  code *local_40;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ParticleSwarmState::initializeParticlesInsideBox","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"box lower bounds","");
  checkVarSize(&local_70,&local_b0,
               (int)((ulong)((long)(box_lower->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(box_lower->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),
               this->num_dimensions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"ParticleSwarmState::initializeParticlesInsideBox","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"box upper bounds","");
  checkVarSize(&local_90,&local_d0,
               (int)((ulong)((long)(box_upper->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(box_upper->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),
               this->num_dimensions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  box_lower_00 = (box_lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  box_upper_00 = (box_upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  std::function<double_()>::function((function<double_()> *)&local_50,get_random01);
  initializeParticlesInsideBox(this,box_lower_00,box_upper_00,(function<double_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const std::vector<double> &box_lower, const std::vector<double> &box_upper,
                                                      const std::function<double(void)> get_random01) {
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box lower bounds", box_lower.size(), num_dimensions);
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box upper bounds", box_upper.size(), num_dimensions);
    ParticleSwarmState::initializeParticlesInsideBox(box_lower.data(), box_upper.data(), get_random01);
}